

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AsyncOut.cpp
# Opt level: O3

void amrex::AsyncOut::Wait(void)

{
  return;
}

Assistant:

void Wait ()
{
#ifdef AMREX_USE_MPI
    const int N = s_info.ispot;
    if (N > 0) {
        Vector<MPI_Request> reqs(N);
        Vector<MPI_Status> stats(N);
        for (int i = 0; i < N; ++i) {
            reqs[i] = ParallelDescriptor::Abarrier(s_comm).req();
        }
        ParallelDescriptor::Waitall(reqs, stats);
    }
#endif
}